

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

void __thiscall
DatabaseSnapshot::force_index_files
          (DatabaseSnapshot *this,Task *task,vector<IndexType,_std::allocator<IndexType>_> *types,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *taints,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *targets)

{
  atomic_uint64_t *paVar1;
  pointer pbVar2;
  OnDiskDataset *this_00;
  _Rep_type *p_Var3;
  _Base_ptr p_Var4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  int __c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *target;
  pointer __s;
  string_view_t fmt;
  DbChangeType local_200;
  allocator<char> local_1f9;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_1f8;
  Task *local_1f0;
  pointer local_1e8;
  pointer local_1e0;
  string *local_1d8;
  _Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> local_1d0;
  string local_1b8;
  DBChange local_198;
  DBChange local_150;
  Indexer indexer;
  
  if ((targets->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (targets->
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_1f8 = taints;
    Indexer::Indexer(&indexer,this,types);
    LOCK();
    paVar1 = &task->spec_->work_estimated_;
    args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           (paVar1->super___atomic_base<unsigned_long>)._M_i;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         ((long)(targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(targets->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5) + 1;
    UNLOCK();
    pbVar2 = (targets->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (__s = (targets->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start; __s != pbVar2; __s = __s + 1) {
      fmt.size_ = (size_t)__s;
      fmt.data_ = (char *)0xb;
      spdlog::debug<std::__cxx11::string>((spdlog *)"Indexing {}",fmt,args);
      Indexer::index(&indexer,(char *)__s,__c);
      LOCK();
      paVar1 = &task->spec_->work_done_;
      (paVar1->super___atomic_base<unsigned_long>)._M_i =
           (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
      UNLOCK();
    }
    Indexer::finalize((vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> *)
                      &local_1d0,&indexer);
    local_1e8 = local_1d0._M_impl.super__Vector_impl_data._M_finish;
    p_Var3 = &local_1f8->_M_t;
    local_1f0 = task;
    while (local_1d0._M_impl.super__Vector_impl_data._M_start != local_1e8) {
      this_00 = *local_1d0._M_impl.super__Vector_impl_data._M_start;
      local_200 = Insert;
      local_1e0 = local_1d0._M_impl.super__Vector_impl_data._M_start;
      local_1d8 = OnDiskDataset::get_name_abi_cxx11_(this_00);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b8,"",&local_1f9);
      DBChange::DBChange(&local_150,&local_200,local_1d8,&local_1b8);
      std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                (&task->changes_,&local_150);
      DBChange::~DBChange(&local_150);
      std::__cxx11::string::~string((string *)&local_1b8);
      for (p_Var4 = (local_1f8->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != &(p_Var3->_M_impl).super__Rb_tree_header;
          p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
        local_200 = ToggleTaint;
        OnDiskDataset::get_id_abi_cxx11_(&local_1b8,this_00);
        DBChange::DBChange(&local_198,&local_200,&local_1b8,(string *)(p_Var4 + 1));
        std::vector<DBChange,_std::allocator<DBChange>_>::emplace_back<DBChange>
                  (&task->changes_,&local_198);
        DBChange::~DBChange(&local_198);
        std::__cxx11::string::~string((string *)&local_1b8);
      }
      local_1d0._M_impl.super__Vector_impl_data._M_start = local_1e0 + 1;
    }
    std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::~_Vector_base
              (&local_1d0);
    LOCK();
    paVar1 = &local_1f0->spec_->work_done_;
    (paVar1->super___atomic_base<unsigned_long>)._M_i =
         (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
    UNLOCK();
    Indexer::~Indexer(&indexer);
  }
  return;
}

Assistant:

void DatabaseSnapshot::force_index_files(
    Task *task, const std::vector<IndexType> &types,
    const std::set<std::string> &taints,
    const std::vector<std::string> &targets) const {
    if (targets.empty()) {
        return;
    }

    Indexer indexer(this, types);

    task->spec().estimate_work(targets.size() + 1);

    for (const auto &target : targets) {
        spdlog::debug("Indexing {}", target);
        indexer.index(target);
        task->spec().add_progress(1);
    }

    for (const auto *ds : indexer.finalize()) {
        task->change(DBChange(DbChangeType::Insert, ds->get_name()));
        for (const auto &taint : taints) {
            task->change(
                DBChange(DbChangeType::ToggleTaint, ds->get_id(), taint));
        }
    }

    task->spec().add_progress(1);
}